

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O2

token * __thiscall dh::scanner::getToken(token *__return_storage_ptr__,scanner *this)

{
  token *other;
  allocator local_31;
  string local_30;
  
  if ((this->scanflag == false) ||
     (other = (this->_it)._M_current,
     (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
     super__Vector_impl_data._M_finish == other)) {
    std::__cxx11::string::string((string *)&local_30,"",&local_31);
    token::token(__return_storage_ptr__,&local_30,NONES,0);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    token::token(__return_storage_ptr__,other);
    (this->_it)._M_current = (this->_it)._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

token scanner::getToken()
{
	if ( scanflag == false || _tokens.end() == _it)
	{
		return token( "", TYPE::NONES, 0);
	}

	// use copy constructrue function
	token tmp(*_it);

	// pointer point to next word
	++_it;

	return tmp;
}